

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_percent_encoded(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  char *pcVar1;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  pcVar1 = read_char(uri,len,offset);
  if (*pcVar1 == '%') {
    uri_local._4_4_ = parse_h8(uri,len,offset,settings,userData);
  }
  else {
    uri_local._4_4_ = curi_status_error;
  }
  return uri_local._4_4_;
}

Assistant:

static curi_status parse_percent_encoded(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // percent-encoded = "%" h8
    switch (*read_char(uri,len,offset))
    {
        case '%':
            break;
        default:
            return curi_status_error;
    }

    return parse_h8(uri,len,offset,settings,userData);
}